

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

Handle __thiscall soul::Value::getUnsizedArrayContent(Value *this)

{
  long lVar1;
  PackedData local_20;
  
  getData(&local_20,this);
  lVar1 = PackedData::getAs<long>(&local_20);
  return lVar1;
}

Assistant:

ConstantTable::Handle Value::getUnsizedArrayContent() const { return getData().getAs<ConstantTable::Handle>(); }